

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport.c
# Opt level: O1

TRANSPORT_HANDLE
IoTHubTransport_Create
          (IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol,char *iotHubName,char *iotHubSuffix)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  TRANSPORT_HANDLE __ptr;
  TRANSPORT_PROVIDER *pTVar3;
  TRANSPORT_LL_HANDLE pvVar4;
  LOCK_HANDLE handle;
  LOCK_HANDLE handle_00;
  VECTOR_HANDLE pVVar5;
  char *pcVar6;
  IOTHUBTRANSPORT_CONFIG transportLLConfig;
  TRANSPORT_CALLBACKS_INFO transport_cb;
  IOTHUB_CLIENT_CONFIG local_60;
  
  if ((iotHubName == (char *)0x0 || protocol == (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0) ||
      iotHubSuffix == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                ,"IoTHubTransport_Create",0x2c,1,
                "Invalid NULL argument, protocol [%p], name [%p], suffix [%p].",protocol,iotHubName,
                iotHubSuffix);
      return (TRANSPORT_HANDLE)0x0;
    }
  }
  else {
    iVar1 = IoTHubClientCore_LL_GetTransportCallbacks(&transport_cb);
    if (iVar1 == 0) {
      __ptr = (TRANSPORT_HANDLE)malloc(0xf0);
      if (__ptr == (TRANSPORT_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar6 = "Transport handle was not allocated.";
          iVar1 = 0x39;
          goto LAB_00127e03;
        }
      }
      else {
        pTVar3 = (*protocol)();
        transportLLConfig.upperConfig = &local_60;
        local_60.deviceId = (char *)0x0;
        local_60.deviceKey = (char *)0x0;
        local_60.protocolGatewayHostName = (char *)0x0;
        transportLLConfig.auth_module_handle = (IOTHUB_AUTHORIZATION_HANDLE)0x0;
        transportLLConfig.moduleId = (char *)0x0;
        transportLLConfig.waitingToSend = (PDLIST_ENTRY)0x0;
        local_60.protocol = protocol;
        local_60.iotHubName = iotHubName;
        local_60.iotHubSuffix = iotHubSuffix;
        pvVar4 = (*pTVar3->IoTHubTransport_Create)(&transportLLConfig,&transport_cb,(void *)0x0);
        __ptr->transportLLHandle = pvVar4;
        if (pvVar4 == (TRANSPORT_LL_HANDLE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                      ,"IoTHubTransport_Create",0x4e,1,"Lower Layer transport not created.");
          }
        }
        else {
          handle = Lock_Init();
          __ptr->lockHandle = handle;
          if (handle == (LOCK_HANDLE)0x0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                        ,"IoTHubTransport_Create",0x57,1,"transport Lock not created.");
            }
          }
          else {
            handle_00 = Lock_Init();
            __ptr->clientsLockHandle = handle_00;
            if (handle_00 == (LOCK_HANDLE)0x0) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                          ,"IoTHubTransport_Create",0x5e,1,"clients Lock not created.");
              }
            }
            else {
              pVVar5 = VECTOR_create(8);
              __ptr->clients = pVVar5;
              if (pVVar5 != (VECTOR_HANDLE)0x0) {
                __ptr->stopThread = 1;
                __ptr->clientDoWork = (IOTHUB_CLIENT_MULTIPLEXED_DO_WORK)0x0;
                __ptr->workerThreadHandle = (THREAD_HANDLE)0x0;
                __ptr->IoTHubTransport_GetHostname = pTVar3->IoTHubTransport_GetHostname;
                __ptr->IoTHubTransport_SetOption = pTVar3->IoTHubTransport_SetOption;
                __ptr->IoTHubTransport_Create = pTVar3->IoTHubTransport_Create;
                __ptr->IoTHubTransport_Destroy = pTVar3->IoTHubTransport_Destroy;
                __ptr->IoTHubTransport_Register = pTVar3->IoTHubTransport_Register;
                __ptr->IoTHubTransport_Unregister = pTVar3->IoTHubTransport_Unregister;
                __ptr->IoTHubTransport_Subscribe = pTVar3->IoTHubTransport_Subscribe;
                __ptr->IoTHubTransport_Unsubscribe = pTVar3->IoTHubTransport_Unsubscribe;
                __ptr->IoTHubTransport_DoWork = pTVar3->IoTHubTransport_DoWork;
                __ptr->IoTHubTransport_SetRetryPolicy = pTVar3->IoTHubTransport_SetRetryPolicy;
                __ptr->IoTHubTransport_GetSendStatus = pTVar3->IoTHubTransport_GetSendStatus;
                return __ptr;
              }
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                          ,"IoTHubTransport_Create",0x69,1,"clients list not created.");
              }
              Lock_Deinit(handle_00);
            }
            Lock_Deinit(handle);
          }
          (*pTVar3->IoTHubTransport_Destroy)(pvVar4);
        }
        free(__ptr);
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar6 = "Failure getting transport callbacks";
        iVar1 = 0x31;
LAB_00127e03:
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                  ,"IoTHubTransport_Create",iVar1,1,pcVar6);
        return (TRANSPORT_HANDLE)0x0;
      }
    }
  }
  return (TRANSPORT_HANDLE)0x0;
}

Assistant:

TRANSPORT_HANDLE IoTHubTransport_Create(IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol, const char* iotHubName, const char* iotHubSuffix)
{
    TRANSPORT_HANDLE_DATA *result;
    TRANSPORT_CALLBACKS_INFO transport_cb;

    if (protocol == NULL || iotHubName == NULL || iotHubSuffix == NULL)
    {
        LogError("Invalid NULL argument, protocol [%p], name [%p], suffix [%p].", protocol, iotHubName, iotHubSuffix);
        result = NULL;
    }
    else if (IoTHubClientCore_LL_GetTransportCallbacks(&transport_cb) != 0)
    {
        LogError("Failure getting transport callbacks");
        result = NULL;
    }
    else
    {
        result = (TRANSPORT_HANDLE_DATA*)malloc(sizeof(TRANSPORT_HANDLE_DATA));
        if (result == NULL)
        {
            LogError("Transport handle was not allocated.");
        }
        else
        {
            TRANSPORT_PROVIDER * transportProtocol = (TRANSPORT_PROVIDER*)(protocol());
            IOTHUB_CLIENT_CONFIG upperConfig;
            upperConfig.deviceId = NULL;
            upperConfig.deviceKey = NULL;
            upperConfig.iotHubName = iotHubName;
            upperConfig.iotHubSuffix = iotHubSuffix;
            upperConfig.protocol = protocol;
            upperConfig.protocolGatewayHostName = NULL;

            IOTHUBTRANSPORT_CONFIG transportLLConfig;
            memset(&transportLLConfig, 0, sizeof(IOTHUBTRANSPORT_CONFIG));
            transportLLConfig.upperConfig = &upperConfig;
            transportLLConfig.waitingToSend = NULL;

            result->transportLLHandle = transportProtocol->IoTHubTransport_Create(&transportLLConfig, &transport_cb, NULL);
            if (result->transportLLHandle == NULL)
            {
                LogError("Lower Layer transport not created.");
                free(result);
                result = NULL;
            }
            else
            {
                result->lockHandle = Lock_Init();
                if (result->lockHandle == NULL)
                {
                    LogError("transport Lock not created.");
                    transportProtocol->IoTHubTransport_Destroy(result->transportLLHandle);
                    free(result);
                    result = NULL;
                }
                else if ((result->clientsLockHandle = Lock_Init()) == NULL)
                {
                    LogError("clients Lock not created.");
                    Lock_Deinit(result->lockHandle);
                    transportProtocol->IoTHubTransport_Destroy(result->transportLLHandle);
                    free(result);
                    result = NULL;
                }
                else
                {
                    result->clients = VECTOR_create(sizeof(IOTHUB_CLIENT_CORE_HANDLE));
                    if (result->clients == NULL)
                    {
                        LogError("clients list not created.");
                        Lock_Deinit(result->clientsLockHandle);
                        Lock_Deinit(result->lockHandle);
                        transportProtocol->IoTHubTransport_Destroy(result->transportLLHandle);
                        free(result);
                        result = NULL;
                    }
                    else
                    {
                        result->stopThread = 1;
                        result->clientDoWork = NULL;
                        result->workerThreadHandle = NULL; /* create thread when work needs to be done */
                        result->IoTHubTransport_GetHostname = transportProtocol->IoTHubTransport_GetHostname;
                        result->IoTHubTransport_SetOption = transportProtocol->IoTHubTransport_SetOption;
                        result->IoTHubTransport_Create = transportProtocol->IoTHubTransport_Create;
                        result->IoTHubTransport_Destroy = transportProtocol->IoTHubTransport_Destroy;
                        result->IoTHubTransport_Register = transportProtocol->IoTHubTransport_Register;
                        result->IoTHubTransport_Unregister = transportProtocol->IoTHubTransport_Unregister;
                        result->IoTHubTransport_Subscribe = transportProtocol->IoTHubTransport_Subscribe;
                        result->IoTHubTransport_Unsubscribe = transportProtocol->IoTHubTransport_Unsubscribe;
                        result->IoTHubTransport_DoWork = transportProtocol->IoTHubTransport_DoWork;
                        result->IoTHubTransport_SetRetryPolicy = transportProtocol->IoTHubTransport_SetRetryPolicy;
                        result->IoTHubTransport_GetSendStatus = transportProtocol->IoTHubTransport_GetSendStatus;
                    }
                }
            }
        }
    }

    return result;
}